

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::majorUpdateFtranPrepare(HEkkDual *this)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  reference pvVar4;
  reference pvVar5;
  double in_RDI;
  HVectorBase<double> *unaff_retaddr;
  HVector *iColumn;
  MFinish *iFinish;
  double in_stack_00000018;
  HighsInt iFn_1;
  HighsInt iRow;
  HighsInt k;
  double pivotX;
  double *jRow_epArray;
  MFinish *jFinish;
  HighsInt jFn;
  HVector *Vec;
  MFinish *finish;
  HighsInt iFn;
  int local_4c;
  int local_44;
  HVectorBase<double> *in_stack_ffffffffffffffc0;
  int local_24;
  undefined4 in_stack_fffffffffffffff0;
  int iVar6;
  double pivotX_00;
  
  pivotX_00 = in_RDI;
  HVectorBase<double>::clear(in_stack_ffffffffffffffc0);
  for (iVar6 = 0; iVar6 < *(int *)((long)in_RDI + 0x14cc); iVar6 = iVar6 + 1) {
    lVar2 = *(long *)((long)in_RDI + (long)iVar6 * 0x78 + 0x2788);
    HighsSparseMatrix::collectAj
              ((HighsSparseMatrix *)jRow_epArray,(HVector *)pivotX,k,in_stack_00000018);
    local_24 = iVar6;
    while (local_24 = local_24 + -1, -1 < local_24) {
      pdVar3 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x79186a);
      in_stack_ffffffffffffffc0 = (HVectorBase<double> *)0x0;
      for (local_44 = 0; local_44 < *(int *)(lVar2 + 4); local_44 = local_44 + 1) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(lVar2 + 8),(long)local_44);
        iVar1 = *pvVar4;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x20),(long)iVar1);
        in_stack_ffffffffffffffc0 =
             (HVectorBase<double> *)(*pvVar5 * pdVar3[iVar1] + (double)in_stack_ffffffffffffffc0);
      }
      if (1e-14 < ABS((double)in_stack_ffffffffffffffc0)) {
        in_stack_ffffffffffffffc0 =
             (HVectorBase<double> *)
             ((double)in_stack_ffffffffffffffc0 /
             *(double *)((long)in_RDI + (long)local_24 * 0x78 + 0x2750));
        HighsSparseMatrix::collectAj
                  ((HighsSparseMatrix *)jRow_epArray,(HVector *)pivotX,k,in_stack_00000018);
        HighsSparseMatrix::collectAj
                  ((HighsSparseMatrix *)jRow_epArray,(HVector *)pivotX,k,in_stack_00000018);
      }
    }
    HVectorBase<double>::saxpy<double,double>
              (unaff_retaddr,pivotX_00,
               (HVectorBase<double> *)CONCAT44(iVar6,in_stack_fffffffffffffff0));
  }
  for (local_4c = 0; local_4c < *(int *)((long)in_RDI + 0x14cc); local_4c = local_4c + 1) {
    lVar2 = *(long *)((long)in_RDI + (long)local_4c * 0x78 + 0x2780);
    HVectorBase<double>::clear(in_stack_ffffffffffffffc0);
    *(undefined1 *)(lVar2 + 0x78) = 1;
    HighsSparseMatrix::collectAj
              ((HighsSparseMatrix *)jRow_epArray,(HVector *)pivotX,k,in_stack_00000018);
  }
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranPrepare() {
  // Prepare FTRAN BFRT buffer
  col_BFRT.clear();
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Vec = finish->col_BFRT;
    a_matrix->collectAj(*Vec, finish->variable_in, finish->theta_primal);

    // Update this buffer by previous Row_ep
    for (HighsInt jFn = iFn - 1; jFn >= 0; jFn--) {
      MFinish* jFinish = &multi_finish[jFn];
      double* jRow_epArray = jFinish->row_ep->array.data();
      double pivotX = 0;
      for (HighsInt k = 0; k < Vec->count; k++) {
        HighsInt iRow = Vec->index[k];
        pivotX += Vec->array[iRow] * jRow_epArray[iRow];
      }
      if (fabs(pivotX) > kHighsTiny) {
        pivotX /= jFinish->alpha_row;
        a_matrix->collectAj(*Vec, jFinish->variable_in, -pivotX);
        a_matrix->collectAj(*Vec, jFinish->variable_out, pivotX);
      }
    }
    col_BFRT.saxpy(1.0, Vec);
  }

  // Prepare regular FTRAN buffer
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* iFinish = &multi_finish[iFn];
    HVector* iColumn = iFinish->col_aq;
    iColumn->clear();
    iColumn->packFlag = true;
    a_matrix->collectAj(*iColumn, iFinish->variable_in, 1);
  }
}